

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipeDensity.cpp
# Opt level: O0

void __thiscall
OpenMD::PipeDensity::PipeDensity
          (PipeDensity *this,SimInfo *info,string *filename,string *sele,int nbins,int nbins2,
          int axis)

{
  undefined1 uVar1;
  string *in_RCX;
  string *in_RDI;
  undefined4 in_R8D;
  undefined4 in_stack_00000008;
  undefined4 in_stack_0000000c;
  SelectionEvaluator *in_stack_00000010;
  uint i;
  SimInfo *in_stack_000001b8;
  SelectionManager *in_stack_000001c0;
  undefined4 in_stack_ffffffffffffff08;
  uint in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  int iVar2;
  SimInfo *in_stack_ffffffffffffff18;
  undefined7 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff27;
  string *this_00;
  string *this_01;
  SelectionEvaluator *this_02;
  SelectionEvaluator *this_03;
  string local_98 [32];
  string local_78 [36];
  uint local_54;
  undefined4 local_24;
  string *local_20;
  
  local_24 = in_R8D;
  local_20 = in_RCX;
  StaticAnalyser::StaticAnalyser
            ((StaticAnalyser *)CONCAT17(in_stack_ffffffffffffff27,in_stack_ffffffffffffff20),
             in_stack_ffffffffffffff18,
             (string *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
             in_stack_ffffffffffffff0c);
  *(undefined ***)in_RDI = &PTR__PipeDensity_0055fc88;
  this_03 = (SelectionEvaluator *)(in_RDI[6].field_2._M_local_buf + 8);
  std::__cxx11::string::string((string *)this_03,local_20);
  SelectionEvaluator::SelectionEvaluator
            (in_stack_00000010,(SimInfo *)CONCAT44(in_stack_0000000c,in_stack_00000008));
  this_02 = (SelectionEvaluator *)&in_RDI[0x32]._M_string_length;
  SelectionManager::SelectionManager(in_stack_000001c0,in_stack_000001b8);
  *(undefined4 *)&in_RDI[0x38].field_2 = local_24;
  *(undefined4 *)((long)&in_RDI[0x38].field_2 + 4) = in_stack_00000008;
  this_00 = (string *)(in_RDI[0x38].field_2._M_local_buf + 8);
  std::__cxx11::string::string(this_00);
  this_01 = (string *)(in_RDI[0x39].field_2._M_local_buf + 8);
  std::__cxx11::string::string(this_01);
  std::
  vector<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
  ::vector((vector<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
            *)0x197bed);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x197c03);
  SelectionEvaluator::loadScriptString(this_03,in_RDI);
  uVar1 = SelectionEvaluator::isDynamic((SelectionEvaluator *)((long)&in_RDI[7].field_2 + 8));
  if (!(bool)uVar1) {
    in_stack_ffffffffffffff18 = (SimInfo *)&in_RDI[0x32]._M_string_length;
    SelectionEvaluator::evaluate(this_02);
    SelectionManager::setSelectionSet
              ((SelectionManager *)CONCAT17(uVar1,in_stack_ffffffffffffff20),
               (SelectionSet *)in_stack_ffffffffffffff18);
    SelectionSet::~SelectionSet((SelectionSet *)0x197c8d);
  }
  std::
  vector<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
  ::resize((vector<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
            *)this_01,(size_type)this_00);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)this_01,(size_type)this_00);
  for (local_54 = 0; local_54 < *(uint *)&in_RDI[0x38].field_2; local_54 = local_54 + 1) {
    std::
    vector<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
    ::operator[]((vector<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>,_std::allocator<std::vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>_>_>
                  *)(in_RDI + 0x3b),(ulong)local_54);
    std::
    vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
    ::resize((vector<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>,_std::allocator<std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>_>
              *)this_01,(size_type)this_00);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator[]((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)((long)&in_RDI[0x3b].field_2 + 8),(ulong)local_54);
    std::vector<double,_std::allocator<double>_>::resize
              ((vector<double,_std::allocator<double>_> *)this_01,(size_type)this_00);
  }
  iVar2 = *(int *)((long)&in_RDI[0x38].field_2 + 4);
  *(int *)((long)&in_RDI[0x3a].field_2 + 8) = iVar2 + 1 + ((iVar2 + 1) / 3) * -3;
  iVar2 = *(int *)((long)&in_RDI[0x38].field_2 + 4);
  *(int *)((long)&in_RDI[0x3a].field_2 + 0xc) = iVar2 + 2 + ((iVar2 + 2) / 3) * -3;
  iVar2 = *(int *)((long)&in_RDI[0x38].field_2 + 4);
  if (iVar2 == 0) {
    std::__cxx11::string::operator=((string *)(in_RDI[0x38].field_2._M_local_buf + 8),"y");
    std::__cxx11::string::operator=((string *)(in_RDI[0x39].field_2._M_local_buf + 8),"z");
  }
  else if (iVar2 == 1) {
    std::__cxx11::string::operator=((string *)(in_RDI[0x38].field_2._M_local_buf + 8),"z");
    std::__cxx11::string::operator=((string *)(in_RDI[0x39].field_2._M_local_buf + 8),"x");
  }
  else {
    std::__cxx11::string::operator=((string *)(in_RDI[0x38].field_2._M_local_buf + 8),"x");
    std::__cxx11::string::operator=((string *)(in_RDI[0x39].field_2._M_local_buf + 8),"y");
  }
  getPrefix((string *)in_stack_ffffffffffffff18);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_ffffffffffffff18,(char *)CONCAT44(iVar2,in_stack_ffffffffffffff10));
  StaticAnalyser::setOutputName
            ((StaticAnalyser *)CONCAT44(iVar2,in_stack_ffffffffffffff10),
             (string *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_98);
  return;
}

Assistant:

PipeDensity::PipeDensity(SimInfo* info, const std::string& filename,
                           const std::string& sele, int nbins, int nbins2,
                           int axis) :
      StaticAnalyser(info, filename, nbins2),
      selectionScript_(sele), evaluator_(info), seleMan_(info), nBins2_(nbins),
      axis_(axis) {
    evaluator_.loadScriptString(sele);
    if (!evaluator_.isDynamic()) {
      seleMan_.setSelectionSet(evaluator_.evaluate());
    }

    // fixed number of bins

    sliceSDLists_.resize(nBins2_);
    density_.resize(nBins2_);
    for (unsigned int i = 0; i < nBins2_; ++i) {
      sliceSDLists_[i].resize(nBins_);
      density_[i].resize(nBins_);
    }

    // Compute complementary axes to the privileged axis
    axis1_ = (axis_ + 1) % 3;
    axis2_ = (axis_ + 2) % 3;

    // Set the axis labels for the non-privileged axes
    switch (axis_) {
    case 0:
      axisLabel1_ = "y";
      axisLabel2_ = "z";
      break;
    case 1:
      axisLabel1_ = "z";
      axisLabel2_ = "x";
      break;
    case 2:
    default:
      axisLabel1_ = "x";
      axisLabel2_ = "y";
      break;
    }

    setOutputName(getPrefix(filename) + ".PipeDensity");
  }